

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

void Fra_ImpCompactArray(Vec_Int_t *vImps)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar5 = vImps->nSize;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar3 = 0;
  }
  else {
    piVar2 = vImps->pArray;
    lVar4 = 0;
    uVar3 = 0;
    do {
      iVar1 = piVar2[lVar4];
      if (iVar1 != 0) {
        if (((int)uVar3 < 0) || ((int)uVar6 <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar6 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
        piVar2[uVar6] = iVar1;
      }
      lVar4 = lVar4 + 1;
      uVar5 = vImps->nSize;
      uVar6 = (ulong)(int)uVar5;
    } while (lVar4 < (long)uVar6);
  }
  if ((int)uVar5 < (int)uVar3) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vImps->nSize = uVar3;
  return;
}

Assistant:

void Fra_ImpCompactArray( Vec_Int_t * vImps )
{
    int i, k, Imp;
    k = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
        if ( Imp )
            Vec_IntWriteEntry( vImps, k++, Imp );
    Vec_IntShrink( vImps, k );
}